

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O1

void __thiscall FIX::SessionID::SessionID(SessionID *this,SessionID *param_1)

{
  pointer pcVar1;
  
  (this->m_beginString).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_001592c8;
  (this->m_beginString).super_StringField.super_FieldBase.m_tag =
       (param_1->m_beginString).super_StringField.super_FieldBase.m_tag;
  (this->m_beginString).super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&(this->m_beginString).super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (param_1->m_beginString).super_StringField.super_FieldBase.m_string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_beginString).super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + (param_1->m_beginString).super_StringField.super_FieldBase.m_string.
                      _M_string_length);
  (this->m_beginString).super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&(this->m_beginString).super_StringField.super_FieldBase.m_data.field_2;
  (this->m_beginString).super_StringField.super_FieldBase.m_data._M_string_length = 0;
  (this->m_beginString).super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  (this->m_beginString).super_StringField.super_FieldBase.m_metrics =
       (param_1->m_beginString).super_StringField.super_FieldBase.m_metrics;
  (this->m_beginString).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_001597f0;
  (this->m_senderCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_001592c8;
  (this->m_senderCompID).super_StringField.super_FieldBase.m_tag =
       (param_1->m_senderCompID).super_StringField.super_FieldBase.m_tag;
  (this->m_senderCompID).super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&(this->m_senderCompID).super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (param_1->m_senderCompID).super_StringField.super_FieldBase.m_string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_senderCompID).super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + (param_1->m_senderCompID).super_StringField.super_FieldBase.m_string.
                      _M_string_length);
  (this->m_senderCompID).super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&(this->m_senderCompID).super_StringField.super_FieldBase.m_data.field_2;
  (this->m_senderCompID).super_StringField.super_FieldBase.m_data._M_string_length = 0;
  (this->m_senderCompID).super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  (this->m_senderCompID).super_StringField.super_FieldBase.m_metrics =
       (param_1->m_senderCompID).super_StringField.super_FieldBase.m_metrics;
  (this->m_senderCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0015ecf8;
  (this->m_targetCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_001592c8;
  (this->m_targetCompID).super_StringField.super_FieldBase.m_tag =
       (param_1->m_targetCompID).super_StringField.super_FieldBase.m_tag;
  (this->m_targetCompID).super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&(this->m_targetCompID).super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (param_1->m_targetCompID).super_StringField.super_FieldBase.m_string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_targetCompID).super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + (param_1->m_targetCompID).super_StringField.super_FieldBase.m_string.
                      _M_string_length);
  (this->m_targetCompID).super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&(this->m_targetCompID).super_StringField.super_FieldBase.m_data.field_2;
  (this->m_targetCompID).super_StringField.super_FieldBase.m_data._M_string_length = 0;
  (this->m_targetCompID).super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  (this->m_targetCompID).super_StringField.super_FieldBase.m_metrics =
       (param_1->m_targetCompID).super_StringField.super_FieldBase.m_metrics;
  (this->m_targetCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0015ed30;
  (this->m_sessionQualifier)._M_dataplus._M_p = (pointer)&(this->m_sessionQualifier).field_2;
  pcVar1 = (param_1->m_sessionQualifier)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_sessionQualifier,pcVar1,
             pcVar1 + (param_1->m_sessionQualifier)._M_string_length);
  this->m_isFIXT = param_1->m_isFIXT;
  (this->m_frozenString)._M_dataplus._M_p = (pointer)&(this->m_frozenString).field_2;
  pcVar1 = (param_1->m_frozenString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_frozenString,pcVar1,
             pcVar1 + (param_1->m_frozenString)._M_string_length);
  return;
}

Assistant:

SessionID() { toString(m_frozenString); }